

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::ProcessFunction(RelaxFloatOpsPass *this,Function *func)

{
  CFG *this_00;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_01;
  pointer bb;
  anon_class_16_2_3b81a10e local_50;
  function<void_(spvtools::opt::BasicBlock_*)> local_40;
  bool local_19;
  Function *pFStack_18;
  bool modified;
  Function *func_local;
  RelaxFloatOpsPass *this_local;
  
  local_19 = false;
  pFStack_18 = func;
  func_local = (Function *)this;
  this_00 = Pass::cfg(&this->super_Pass);
  this_01 = opt::Function::entry(pFStack_18);
  bb = std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
       get(this_01);
  local_50.modified = &local_19;
  local_50.this = this;
  std::function<void(spvtools::opt::BasicBlock*)>::
  function<spvtools::opt::RelaxFloatOpsPass::ProcessFunction(spvtools::opt::Function*)::__0,void>
            ((function<void(spvtools::opt::BasicBlock*)> *)&local_40,&local_50);
  CFG::ForEachBlockInReversePostOrder(this_00,bb,&local_40);
  std::function<void_(spvtools::opt::BasicBlock_*)>::~function(&local_40);
  return (bool)(local_19 & 1);
}

Assistant:

bool RelaxFloatOpsPass::ProcessFunction(Function* func) {
  bool modified = false;
  cfg()->ForEachBlockInReversePostOrder(
      func->entry().get(), [&modified, this](BasicBlock* bb) {
        for (auto ii = bb->begin(); ii != bb->end(); ++ii)
          modified |= ProcessInst(&*ii);
      });
  return modified;
}